

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 id;
  int iVar2;
  ostream *poVar3;
  mapped_type_conflict1 *pmVar4;
  AnimatedLightNode *pAVar5;
  LightNode *pLVar6;
  TriangleMeshNode *pTVar7;
  QuadMeshNode *pQVar8;
  SubdivMeshNode *pSVar9;
  HairSetNode *pHVar10;
  AnimatedPerspectiveCameraNode *pAVar11;
  PerspectiveCameraNode *pPVar12;
  GroupNode *pGVar13;
  runtime_error *this_00;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  ssize_t id_00;
  ssize_t id_01;
  ulong uVar16;
  bool bVar17;
  TransformNode *local_b0;
  Ref<embree::SceneGraph::GroupNode> local_80;
  Ref<embree::SceneGraph::TransformNode> local_78;
  Ref<embree::SceneGraph::PerspectiveCameraNode> local_70;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_68;
  Ref<embree::SceneGraph::HairSetNode> local_60;
  Ref<embree::SceneGraph::SubdivMeshNode> local_58;
  Ref<embree::SceneGraph::QuadMeshNode> local_50;
  Ref<embree::SceneGraph::TriangleMeshNode> local_48;
  Ref<embree::SceneGraph::LightNode> local_40;
  Ref<embree::SceneGraph::AnimatedLightNode> local_38;
  
  p_Var15 = (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var14 = &p_Var1->_M_header;
  if (p_Var15 != (_Base_ptr)0x0) {
    do {
      bVar17 = *(Node **)(p_Var15 + 1) < node->ptr;
      if (!bVar17) {
        p_Var14 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[bVar17];
    } while (p_Var15 != (_Base_ptr)0x0);
  }
  p_Var15 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
     (p_Var15 = p_Var14, node->ptr < *(Node **)(p_Var14 + 1))) {
    p_Var15 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var15 == p_Var1) {
    id = this->currentNodeID;
    this->currentNodeID = id + 1;
    pmVar4 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
             ::operator[](&this->nodeMap,node);
    *pmVar4 = id;
    iVar2 = std::__cxx11::string::compare((char *)&node->ptr->fileName);
    if (iVar2 == 0) {
      if (node->ptr == (Node *)0x0) {
        pAVar5 = (AnimatedLightNode *)0x0;
      }
      else {
        pAVar5 = (AnimatedLightNode *)
                 __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                &SceneGraph::AnimatedLightNode::typeinfo,0);
      }
      if (pAVar5 == (AnimatedLightNode *)0x0) {
        if (node->ptr == (Node *)0x0) {
          pLVar6 = (LightNode *)0x0;
        }
        else {
          pLVar6 = (LightNode *)
                   __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                  &SceneGraph::LightNode::typeinfo,0);
        }
        if (pLVar6 == (LightNode *)0x0) {
          if (node->ptr == (Node *)0x0) {
            pTVar7 = (TriangleMeshNode *)0x0;
          }
          else {
            pTVar7 = (TriangleMeshNode *)
                     __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TriangleMeshNode::typeinfo,0);
          }
          if (pTVar7 == (TriangleMeshNode *)0x0) {
            if (node->ptr == (Node *)0x0) {
              pQVar8 = (QuadMeshNode *)0x0;
            }
            else {
              pQVar8 = (QuadMeshNode *)
                       __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::QuadMeshNode::typeinfo,0);
            }
            if (pQVar8 == (QuadMeshNode *)0x0) {
              if (node->ptr == (Node *)0x0) {
                pSVar9 = (SubdivMeshNode *)0x0;
              }
              else {
                pSVar9 = (SubdivMeshNode *)
                         __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::SubdivMeshNode::typeinfo,0);
              }
              if (pSVar9 == (SubdivMeshNode *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  pHVar10 = (HairSetNode *)0x0;
                }
                else {
                  pHVar10 = (HairSetNode *)
                            __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::HairSetNode::typeinfo,0);
                }
                if (pHVar10 == (HairSetNode *)0x0) {
                  if (node->ptr == (Node *)0x0) {
                    pAVar11 = (AnimatedPerspectiveCameraNode *)0x0;
                  }
                  else {
                    pAVar11 = (AnimatedPerspectiveCameraNode *)
                              __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0)
                    ;
                  }
                  if (pAVar11 == (AnimatedPerspectiveCameraNode *)0x0) {
                    if (node->ptr == (Node *)0x0) {
                      pPVar12 = (PerspectiveCameraNode *)0x0;
                    }
                    else {
                      pPVar12 = (PerspectiveCameraNode *)
                                __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                               &SceneGraph::PerspectiveCameraNode::typeinfo,0);
                    }
                    if (pPVar12 == (PerspectiveCameraNode *)0x0) {
                      if (node->ptr == (Node *)0x0) {
                        local_b0 = (TransformNode *)0x0;
                      }
                      else {
                        local_b0 = (TransformNode *)
                                   __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                                  &SceneGraph::TransformNode::typeinfo,0);
                      }
                      if (local_b0 == (TransformNode *)0x0) {
                        if (node->ptr == (Node *)0x0) {
                          pGVar13 = (GroupNode *)0x0;
                        }
                        else {
                          pGVar13 = (GroupNode *)
                                    __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                                   &SceneGraph::GroupNode::typeinfo,0);
                        }
                        if (pGVar13 == (GroupNode *)0x0) {
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,"unknown node type");
                          __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        (*(pGVar13->super_Node).super_RefCount._vptr_RefCount[2])(pGVar13);
                        local_80.ptr = pGVar13;
                        (*(pGVar13->super_Node).super_RefCount._vptr_RefCount[2])(pGVar13);
                        store(this,&local_80,id);
                        (*(pGVar13->super_Node).super_RefCount._vptr_RefCount[3])(pGVar13);
                        (*(pGVar13->super_Node).super_RefCount._vptr_RefCount[3])(pGVar13);
                      }
                      else {
                        (*(local_b0->super_Node).super_RefCount._vptr_RefCount[2])();
                        local_78.ptr = local_b0;
                        (*(local_b0->super_Node).super_RefCount._vptr_RefCount[2])();
                        store(this,&local_78,id);
                        (*(local_b0->super_Node).super_RefCount._vptr_RefCount[3])();
                      }
                      if (local_b0 != (TransformNode *)0x0) {
                        (*(local_b0->super_Node).super_RefCount._vptr_RefCount[3])();
                      }
                    }
                    else {
                      (*(pPVar12->super_Node).super_RefCount._vptr_RefCount[2])(pPVar12);
                      local_70.ptr = pPVar12;
                      (*(pPVar12->super_Node).super_RefCount._vptr_RefCount[2])(pPVar12);
                      store(this,&local_70,id);
                      (*(pPVar12->super_Node).super_RefCount._vptr_RefCount[3])();
                    }
                    if (pPVar12 != (PerspectiveCameraNode *)0x0) {
                      (*(pPVar12->super_Node).super_RefCount._vptr_RefCount[3])();
                    }
                  }
                  else {
                    (*(pAVar11->super_PerspectiveCameraNode).super_Node.super_RefCount.
                      _vptr_RefCount[2])();
                    local_68.ptr = pAVar11;
                    (*(pAVar11->super_PerspectiveCameraNode).super_Node.super_RefCount.
                      _vptr_RefCount[2])();
                    store(this,&local_68,id_01);
                    (*(pAVar11->super_PerspectiveCameraNode).super_Node.super_RefCount.
                      _vptr_RefCount[3])();
                  }
                  if (pAVar11 != (AnimatedPerspectiveCameraNode *)0x0) {
                    (*(pAVar11->super_PerspectiveCameraNode).super_Node.super_RefCount.
                      _vptr_RefCount[3])();
                  }
                }
                else {
                  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[2])();
                  local_60.ptr = pHVar10;
                  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[2])();
                  store(this,&local_60,id);
                  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[3])();
                }
                if (pHVar10 != (HairSetNode *)0x0) {
                  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[3])();
                }
              }
              else {
                (*(pSVar9->super_Node).super_RefCount._vptr_RefCount[2])();
                local_58.ptr = pSVar9;
                (*(pSVar9->super_Node).super_RefCount._vptr_RefCount[2])();
                store(this,&local_58,id);
                (*(pSVar9->super_Node).super_RefCount._vptr_RefCount[3])();
              }
              if (pSVar9 != (SubdivMeshNode *)0x0) {
                (*(pSVar9->super_Node).super_RefCount._vptr_RefCount[3])();
              }
            }
            else {
              (*(pQVar8->super_Node).super_RefCount._vptr_RefCount[2])();
              local_50.ptr = pQVar8;
              (*(pQVar8->super_Node).super_RefCount._vptr_RefCount[2])();
              store(this,&local_50,id);
              (*(pQVar8->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            if (pQVar8 != (QuadMeshNode *)0x0) {
              (*(pQVar8->super_Node).super_RefCount._vptr_RefCount[3])();
            }
          }
          else {
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
            local_48.ptr = pTVar7;
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
            store(this,&local_48,id);
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[3])(pTVar7);
          }
          if (pTVar7 != (TriangleMeshNode *)0x0) {
            (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[3])(pTVar7);
          }
        }
        else {
          (*(pLVar6->super_Node).super_RefCount._vptr_RefCount[2])(pLVar6);
          local_40.ptr = pLVar6;
          (*(pLVar6->super_Node).super_RefCount._vptr_RefCount[2])(pLVar6);
          store(this,&local_40,id);
          (*(pLVar6->super_Node).super_RefCount._vptr_RefCount[3])(pLVar6);
        }
        if (pLVar6 != (LightNode *)0x0) {
          (*(pLVar6->super_Node).super_RefCount._vptr_RefCount[3])(pLVar6);
        }
      }
      else {
        (*(pAVar5->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar5);
        local_38.ptr = pAVar5;
        (*(pAVar5->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar5);
        store(this,&local_38,id_00);
        (*(pAVar5->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar5);
      }
      if (pAVar5 != (AnimatedLightNode *)0x0) {
        (*(pAVar5->super_LightNode).super_Node.super_RefCount._vptr_RefCount[3])(pAVar5);
      }
      return;
    }
    if (this->ident != 0) {
      uVar16 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
        uVar16 = uVar16 + 1;
      } while (uVar16 < this->ident);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,"<extern id=\"",0xc);
    poVar3 = std::ostream::_M_insert<long>((long)&this->field_0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" src=\"",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(node->ptr->fileName)._M_dataplus._M_p,
                        (node->ptr->fileName)._M_string_length);
  }
  else {
    if (this->ident != 0) {
      uVar16 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
        uVar16 = uVar16 + 1;
      } while (uVar16 < this->ident);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,"<ref id=\"",9);
    std::
    map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
    ::operator[](&this->nodeMap,node);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::Node> node)
  {
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<ref id=\"" << nodeMap[node] << "\"/>" << std::endl; return;
    }
    
    const ssize_t id = nodeMap[node] = currentNodeID++;
    if (node->fileName != "") {
      tab(); xml << "<extern id=\"" << id << "\" src=\"" << node->fileName << "\"/>" << std::endl; return;
    }

    if      (Ref<SceneGraph::AnimatedLightNode> cnode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) store(cnode,id);
    else if (Ref<SceneGraph::LightNode> cnode = node.dynamicCast<SceneGraph::LightNode>()) store(cnode,id);
    //else if (Ref<SceneGraph::MaterialNode> cnode = node.dynamicCast<SceneGraph::MaterialNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TriangleMeshNode> cnode = node.dynamicCast<SceneGraph::TriangleMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::QuadMeshNode> cnode = node.dynamicCast<SceneGraph::QuadMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::SubdivMeshNode> cnode = node.dynamicCast<SceneGraph::SubdivMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::HairSetNode> cnode = node.dynamicCast<SceneGraph::HairSetNode>()) store(cnode,id);
    else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::PerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TransformNode> cnode = node.dynamicCast<SceneGraph::TransformNode>()) store(cnode,id);
    else if (Ref<SceneGraph::GroupNode> cnode = node.dynamicCast<SceneGraph::GroupNode>()) store(cnode,id);
    else throw std::runtime_error("unknown node type");
  }